

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::TypeAliasType::TypeAliasType(TypeAliasType *this,string_view name,SourceLocation loc)

{
  string_view name_00;
  Type *in_RCX;
  size_t in_RDX;
  SourceLocation in_RSI;
  DeclaredType *in_RDI;
  Symbol *parent;
  bitmask<slang::ast::DeclaredTypeFlags> in_stack_ffffffffffffffc4;
  
  name_00._M_str = (char *)in_RDI;
  name_00._M_len = in_RDX;
  Type::Type(in_RCX,in_stack_ffffffffffffffc4.m_bits,name_00,in_RSI);
  parent = (Symbol *)&in_RDI[1].type;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffc4,TypedefTarget);
  DeclaredType::DeclaredType(in_RDI,parent,in_stack_ffffffffffffffc4);
  *(undefined4 *)&in_RDI[2].type = 0;
  in_RDI[2].typeOrLink.typeSyntax = (DataTypeSyntax *)0x0;
  in_RDI[1].parent = (Symbol *)0x0;
  return;
}

Assistant:

TypeAliasType::TypeAliasType(std::string_view name, SourceLocation loc) :
    Type(SymbolKind::TypeAlias, name, loc), targetType(*this, DeclaredTypeFlags::TypedefTarget) {
    canonical = nullptr;
}